

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.cpp
# Opt level: O2

TimingControl *
slang::ast::DelayControl::fromParams
          (Compilation *compilation,ParameterValueAssignmentSyntax *exprs,ASTContext *context)

{
  bool bVar1;
  int iVar2;
  ParamAssignmentSyntax *pPVar3;
  SyntaxNode *this;
  OrderedParamAssignmentSyntax *pOVar4;
  ExpressionSyntax *pEVar5;
  undefined4 extraout_var;
  DelayControl *ctrl;
  Type *pTVar6;
  TimingControl *pTVar7;
  Diagnostic *diag;
  SourceRange sourceRange;
  Expression *args;
  
  if (((exprs->parameters).elements.size_ + 1 & 0xfffffffffffffffe) == 2) {
    pPVar3 = slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::operator[]
                       (&exprs->parameters,0);
    if ((pPVar3->super_SyntaxNode).kind == OrderedParamAssignment) {
      this = &slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::operator[]
                        (&exprs->parameters,0)->super_SyntaxNode;
      pOVar4 = slang::syntax::SyntaxNode::as<slang::syntax::OrderedParamAssignmentSyntax>(this);
      pEVar5 = not_null<slang::syntax::ExpressionSyntax_*>::get(&pOVar4->expr);
      iVar2 = Expression::bind((int)pEVar5,(sockaddr *)context,0);
      args = (Expression *)CONCAT44(extraout_var,iVar2);
      ctrl = BumpAllocator::
             emplace<slang::ast::DelayControl,slang::ast::Expression_const&,slang::SourceRange_const&>
                       (&compilation->super_BumpAllocator,args,&args->sourceRange);
      bVar1 = Expression::bad(args);
      if (!bVar1) {
        pTVar6 = not_null<const_slang::ast::Type_*>::get(&args->type);
        bVar1 = Type::isNumeric(pTVar6);
        if (bVar1) {
          return &ctrl->super_TimingControl;
        }
        diag = ASTContext::addDiag(context,(DiagCode)0x100008,args->sourceRange);
        pTVar6 = not_null<const_slang::ast::Type_*>::get(&args->type);
        ast::operator<<(diag,pTVar6);
      }
      goto LAB_0023d65f;
    }
  }
  sourceRange = slang::syntax::SyntaxNode::sourceRange(&exprs->super_SyntaxNode);
  ASTContext::addDiag(context,(DiagCode)0x4a0007,sourceRange);
  ctrl = (DelayControl *)0x0;
LAB_0023d65f:
  pTVar7 = TimingControl::badCtrl(compilation,&ctrl->super_TimingControl);
  return pTVar7;
}

Assistant:

TimingControl& DelayControl::fromParams(Compilation& compilation,
                                        const ParameterValueAssignmentSyntax& exprs,
                                        const ASTContext& context) {
    auto& items = exprs.parameters;
    if (items.size() != 1 || items[0]->kind != SyntaxKind::OrderedParamAssignment) {
        context.addDiag(diag::ExpectedNetDelay, exprs.sourceRange());
        return badCtrl(compilation, nullptr);
    }

    auto& expr = Expression::bind(*items[0]->as<OrderedParamAssignmentSyntax>().expr, context);
    auto result = compilation.emplace<DelayControl>(expr, expr.sourceRange);
    if (expr.bad())
        return badCtrl(compilation, result);

    if (!expr.type->isNumeric()) {
        context.addDiag(diag::DelayNotNumeric, expr.sourceRange) << *expr.type;
        return badCtrl(compilation, result);
    }

    return *result;
}